

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::benchmarkEnded
          (XmlReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *benchmarkStats)

{
  XmlFormatting XVar1;
  XmlWriter *pXVar2;
  StringRef SVar3;
  allocator<char> local_149;
  string local_148;
  StringRef local_128;
  rep local_118;
  StringRef local_110;
  rep local_100;
  StringRef local_f8;
  rep local_e8;
  StringRef local_e0;
  allocator<char> local_c9;
  string local_c8;
  StringRef local_a8;
  rep local_98;
  StringRef local_90;
  rep local_80;
  StringRef local_78;
  rep local_68;
  StringRef local_60;
  allocator<char> local_39;
  string local_38;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *local_18;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *benchmarkStats_local
  ;
  XmlReporter *this_local;
  
  local_18 = benchmarkStats;
  benchmarkStats_local =
       (BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mean",&local_39);
  XVar1 = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_38,XVar1);
  local_60 = operator____sr("value",5);
  local_68 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->mean).point);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,local_60,&local_68);
  local_78 = operator____sr("lowerBound",10);
  local_80 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->mean).lower_bound);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,local_78,&local_80);
  local_90 = operator____sr("upperBound",10);
  local_98 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->mean).upper_bound);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,local_90,&local_98);
  local_a8 = operator____sr("ci",2);
  XmlWriter::writeAttribute<double,void>(pXVar2,local_a8,&(local_18->mean).confidence_interval);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"standardDeviation",&local_c9);
  XVar1 = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_c8,XVar1);
  local_e0 = operator____sr("value",5);
  local_e8 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->standardDeviation).point);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,local_e0,&local_e8);
  local_f8 = operator____sr("lowerBound",10);
  local_100 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        (&(local_18->standardDeviation).lower_bound);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,local_f8,&local_100);
  local_110 = operator____sr("upperBound",10);
  local_118 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        (&(local_18->standardDeviation).upper_bound);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,local_110,&local_118);
  local_128 = operator____sr("ci",2);
  XmlWriter::writeAttribute<double,void>
            (pXVar2,local_128,&(local_18->standardDeviation).confidence_interval);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"outliers",&local_149);
  XVar1 = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_148,XVar1);
  SVar3 = operator____sr("variance",8);
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,SVar3,&local_18->outlierVariance);
  SVar3 = operator____sr("lowMild",7);
  pXVar2 = XmlWriter::writeAttribute<int,void>(pXVar2,SVar3,&(local_18->outliers).low_mild);
  SVar3 = operator____sr("lowSevere",9);
  pXVar2 = XmlWriter::writeAttribute<int,void>(pXVar2,SVar3,&(local_18->outliers).low_severe);
  SVar3 = operator____sr("highMild",8);
  pXVar2 = XmlWriter::writeAttribute<int,void>(pXVar2,SVar3,&(local_18->outliers).high_mild);
  SVar3 = operator____sr("highSevere",10);
  XmlWriter::writeAttribute<int,void>(pXVar2,SVar3,&(local_18->outliers).high_severe);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  return;
}

Assistant:

void XmlReporter::benchmarkEnded(BenchmarkStats<> const& benchmarkStats) {
        m_xml.startElement("mean")
            .writeAttribute("value"_sr, benchmarkStats.mean.point.count())
            .writeAttribute("lowerBound"_sr, benchmarkStats.mean.lower_bound.count())
            .writeAttribute("upperBound"_sr, benchmarkStats.mean.upper_bound.count())
            .writeAttribute("ci"_sr, benchmarkStats.mean.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("standardDeviation")
            .writeAttribute("value"_sr, benchmarkStats.standardDeviation.point.count())
            .writeAttribute("lowerBound"_sr, benchmarkStats.standardDeviation.lower_bound.count())
            .writeAttribute("upperBound"_sr, benchmarkStats.standardDeviation.upper_bound.count())
            .writeAttribute("ci"_sr, benchmarkStats.standardDeviation.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("outliers")
            .writeAttribute("variance"_sr, benchmarkStats.outlierVariance)
            .writeAttribute("lowMild"_sr, benchmarkStats.outliers.low_mild)
            .writeAttribute("lowSevere"_sr, benchmarkStats.outliers.low_severe)
            .writeAttribute("highMild"_sr, benchmarkStats.outliers.high_mild)
            .writeAttribute("highSevere"_sr, benchmarkStats.outliers.high_severe);
        m_xml.endElement();
        m_xml.endElement();
    }